

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeIteratorImpl.cpp
# Opt level: O2

DOMNode * __thiscall
xercesc_4_0::DOMNodeIteratorImpl::nextNode
          (DOMNodeIteratorImpl *this,DOMNode *node,bool visitChildren)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DOMException *this_00;
  DOMNode *pDVar2;
  
  if (this->fDetached == true) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fDocument == (DOMDocument *)0x0) {
      pDVar2 = (DOMNode *)&XMLPlatformUtils::fgMemoryManager;
    }
    else {
      pDVar2 = &this->fDocument[10].super_DOMNode;
    }
    DOMException::DOMException(this_00,0xb,0,(MemoryManager *)pDVar2->_vptr_DOMNode);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  if (node == (DOMNode *)0x0) {
    pDVar2 = this->fRoot;
  }
  else {
    if ((visitChildren) &&
       (((this->fExpandEntityReferences != false ||
         (iVar1 = (*node->_vptr_DOMNode[4])(node), iVar1 != 5)) &&
        (iVar1 = (*node->_vptr_DOMNode[0x12])(node), (char)iVar1 != '\0')))) {
      iVar1 = (*node->_vptr_DOMNode[7])(node);
      return (DOMNode *)CONCAT44(extraout_var,iVar1);
    }
    if (this->fRoot == node) {
      pDVar2 = (DOMNode *)0x0;
    }
    else {
      iVar1 = (*node->_vptr_DOMNode[10])(node);
      pDVar2 = (DOMNode *)CONCAT44(extraout_var_00,iVar1);
      while (pDVar2 == (DOMNode *)0x0) {
        iVar1 = (*node->_vptr_DOMNode[5])(node);
        node = (DOMNode *)CONCAT44(extraout_var_01,iVar1);
        if (node == (DOMNode *)0x0) {
          return (DOMNode *)0x0;
        }
        if (node == this->fRoot) {
          return (DOMNode *)0x0;
        }
        iVar1 = (*node->_vptr_DOMNode[10])(node);
        pDVar2 = (DOMNode *)CONCAT44(extraout_var_02,iVar1);
      }
    }
  }
  return pDVar2;
}

Assistant:

DOMNode* DOMNodeIteratorImpl::nextNode (DOMNode* node, bool visitChildren) {
	if (fDetached)
		throw DOMException(DOMException::INVALID_STATE_ERR, 0, GetDOMNodeIteratorMemoryManager);

    if (!node) return fRoot;

    DOMNode* result = 0;
    // only check children if we visit children.
    if (visitChildren) {
        //if hasChildren, return 1st child.
        if ((fExpandEntityReferences || node->getNodeType()!=DOMNode::ENTITY_REFERENCE_NODE) &&
            node->hasChildNodes()) {
            result = node->getFirstChild();
            return result;
        }
    }

    // if hasSibling, return sibling
    if (node != fRoot) {
        result = node->getNextSibling();
        if (result != 0) return result;


        // return parent's 1st sibling.
        DOMNode* parent = node->getParentNode();
        while ((parent != 0) && parent != fRoot) {
            result = parent->getNextSibling();
            if (result != 0) {
                return result;
            } else {
                parent = parent->getParentNode();
            }

        } // while (parent != 0 && parent != fRoot) {
    }
    // end of list, return 0
    return 0;
}